

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall CapabilitiesToStateMask::setFillRectMask(CapabilitiesToStateMask *this)

{
  long in_RDI;
  
  updateStateBits((uint *)(in_RDI + 4),1,false);
  updateStateBits((uint *)(in_RDI + 4),2,false);
  updateStateBits((uint *)(in_RDI + 4),0x10,false);
  updateStateBits((uint *)(in_RDI + 4),0x20,false);
  updateStateBits((uint *)(in_RDI + 4),0x100,true);
  updateStateBits((uint *)(in_RDI + 4),0x1000,true);
  updateStateBits((uint *)(in_RDI + 4),0x2000,false);
  updateStateBits((uint *)(in_RDI + 4),0x4000,false);
  updateStateBits((uint *)(in_RDI + 4),0x10000,false);
  updateStateBits((uint *)(in_RDI + 4),0x20000,false);
  return;
}

Assistant:

void setFillRectMask() {
        updateStateBits(&fillRectMask, STATE_XFORM_SCALE, false);
        updateStateBits(&fillRectMask, STATE_XFORM_COMPLEX, false);

        updateStateBits(&fillRectMask, STATE_BRUSH_PATTERN, false);
        updateStateBits(&fillRectMask, STATE_BRUSH_ALPHA, false);

        updateStateBits(&fillRectMask, STATE_PEN_ENABLED, true);

        //Sub-pixel aliasing should not be sent to the blitter
        updateStateBits(&fillRectMask, STATE_ANTIALIASING, true);
        updateStateBits(&fillRectMask, STATE_ALPHA, false);
        updateStateBits(&fillRectMask, STATE_BLENDING_COMPLEX, false);

        updateStateBits(&fillRectMask, STATE_CLIPSYS_COMPLEX, false);
        updateStateBits(&fillRectMask, STATE_CLIP_COMPLEX, false);
    }